

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Syndicated_Data.cpp
# Opt level: O0

bool __thiscall SRUP_MSG_SYNDICATED_DATA::sourceID(SRUP_MSG_SYNDICATED_DATA *this,uint64_t *source)

{
  uint64_t *puVar1;
  uint64_t *source_local;
  SRUP_MSG_SYNDICATED_DATA *this_local;
  
  if ((this->m_source_ID != (uint64_t *)0x0) && (this->m_source_ID != (uint64_t *)0x0)) {
    operator_delete(this->m_source_ID);
  }
  puVar1 = (uint64_t *)operator_new(8);
  this->m_source_ID = puVar1;
  *this->m_source_ID = *source;
  return true;
}

Assistant:

bool SRUP_MSG_SYNDICATED_DATA::sourceID(const uint64_t *source)
{
    try
    {
        if (m_source_ID != nullptr)
            delete(m_source_ID);

        m_source_ID = new uint64_t;
        std::memcpy(m_source_ID, source, sizeof(*source));
    }
    catch (...)
    {
        m_source_ID = nullptr;
        return false;
    }
    return true;
}